

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpikingPopulation.h
# Opt level: O0

void __thiscall
SpikingPopulation::SpikingPopulation(SpikingPopulation *this,int amount,string *type)

{
  string *in_RDX;
  undefined8 *in_RDI;
  string *in_stack_000000b0;
  int in_stack_000000bc;
  Population *in_stack_000000c0;
  string local_38 [56];
  
  std::__cxx11::string::string(local_38,in_RDX);
  Population::Population(in_stack_000000c0,in_stack_000000bc,in_stack_000000b0);
  std::__cxx11::string::~string(local_38);
  *in_RDI = &PTR_update_0011cd50;
  return;
}

Assistant:

SpikingPopulation(int amount, std::string type) : Population(amount, type) { }